

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElementType::~IfcTransportElementType
          (IfcTransportElementType *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  pointer pcVar5;
  
  pvVar2 = *vtt;
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x21];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       vtt[0x22];
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x23];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       vtt[0x24];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = vtt[0x25];
  *(void **)&(this->super_IfcElementType).field_0x180 = vtt[0x26];
  puVar3 = *(undefined1 **)&(this->super_IfcElementType).field_0x190;
  if (puVar3 != &this->field_0x1a0) {
    operator_delete(puVar3,*(long *)&this->field_0x1a0 + 1);
  }
  pvVar2 = vtt[1];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x1a];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       vtt[0x1b];
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1c];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       vtt[0x1d];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = vtt[0x1e];
  puVar4 = *(undefined1 **)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x158;
  puVar3 = &(this->super_IfcElementType).field_0x168;
  if (puVar4 != puVar3) {
    operator_delete(puVar4,*(long *)puVar3 + 1);
  }
  pvVar2 = vtt[2];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = pvVar2;
  *(void **)(&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x14];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       vtt[0x15];
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x16];
  *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       vtt[0x17];
  pcVar5 = (this->super_IfcElementType).super_IfcTypeProduct.Tag.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcElementType).super_IfcTypeProduct.Tag.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pvVar2 = *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
                      field_0x100;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x110 -
                           (long)pvVar2);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,vtt + 3);
  return;
}

Assistant:

IfcTransportElementType() : Object("IfcTransportElementType") {}